

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::Common::DynamicBinDataView::readFrom
          (DynamicBinDataView *this,uint8 *buffer,uint32 bufLength)

{
  uint32 uVar1;
  ushort uVar2;
  
  uVar1 = 0xfffffffe;
  if (1 < bufLength) {
    uVar2 = *(ushort *)buffer;
    if (BigEndian(unsigned_short)::signature != '\x01') {
      if (BigEndian(unsigned_short)::signature == '\x04') {
        uVar2 = uVar2 << 8 | uVar2 >> 8;
      }
      else {
        uVar2 = 0;
      }
    }
    this->length = uVar2;
    if (uVar2 + 2 <= bufLength) {
      this->data = buffer + 2;
      uVar1 = uVar2 + 2;
    }
  }
  return uVar1;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    uint16 size = 0; memcpy(&size, buffer, 2); length = BigEndian(size);
                    if ((uint32)(length+2) > bufLength) return NotEnoughData;
                    data = &buffer[2];
                    return (uint32)length + 2;
                }